

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98c.c
# Opt level: O3

int main(int ac,char **av)

{
  char *__filename;
  int iVar1;
  FILE *__stream;
  yyscan_t scanner;
  s98c context;
  yyscan_t local_c8;
  s98c local_c0;
  
  memset(&local_c0,0,0x98);
  if (ac - 4U < 0xfffffffe) {
    main_cold_1();
  }
  else {
    __filename = av[1];
    __stream = fopen(__filename,"rb");
    if (__stream != (FILE *)0x0) {
      if (ac == 3) {
        local_c0.output_filename = av[2];
      }
      local_c0.input_filename = __filename;
      init_context(&local_c0);
      yylex_init(&local_c8);
      yyset_in((FILE *)__stream,local_c8);
      iVar1 = yyparse(&local_c0,local_c8);
      yylex_destroy(local_c8);
      fclose(__stream);
      if (iVar1 == 0) {
        write_s98(&local_c0);
      }
      free_context(&local_c0);
      return 0;
    }
    perror(__filename);
  }
  return 1;
}

Assistant:

int main(int ac, char** av)
{
    struct s98c context;
    struct s98c* ctx = &context;
    yyscan_t scanner;
    char* inputfile;
    FILE* infp;
    int ret;

    memset(ctx, 0, sizeof(struct s98c));

    if(ac < 2 || ac > 3) {
#ifdef HAVE_ICONV
        fprintf(stderr, "Usage: %s inputfile.s98ml [outputfile.s98]\nCompiled with iconv support\n", *av);
#else
        fprintf(stderr, "Usage: %s inputfile.s98ml [outputfile.s98]\nCompiled WITHOUT iconv support (cannot use #encoding)\n", *av);
#endif
        return 1;
    }

    inputfile = *++av;
    infp = fopen(inputfile, "rb");
    if(infp == NULL) {
        perror(inputfile);
        return 1;
    }
    ctx->input_filename = inputfile;

    if(ac == 3) {
        ctx->output_filename = *++av;
    }

    init_context(ctx);

    yylex_init(&scanner);

    yyset_in(infp, scanner);

    ret = yyparse(ctx, scanner);

    yylex_destroy(scanner);

    fclose(infp);

    if(ret == 0) {
        write_s98(ctx);
    }

    free_context(ctx);

    return 0;
}